

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::IOEffect::SetEffectDutyCycle(IOEffect *this,KUINT8 EDC)

{
  KException *this_00;
  KString local_40;
  
  if (EDC < 0x65) {
    this->m_ui8EffDtyCyc = EDC;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetEffectDutyCycle","");
  KException::KException<char_const*>
            (this_00,&local_40,7,"Invalid Effect Duty Cycle value. Must be between 0-100.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IOEffect::SetEffectDutyCycle(KUINT8 EDC) noexcept(false)
{
    if( EDC > 100 )throw KException( __FUNCTION__, OUT_OF_BOUNDS, "Invalid Effect Duty Cycle value. Must be between 0-100." );

    m_ui8EffDtyCyc = EDC;
}